

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O0

FMFieldPtr get_FMfieldPtrFromList(FMFieldList field_list,char *fieldname)

{
  int iVar1;
  FMdata_type FVar2;
  char *in_RSI;
  long in_RDI;
  FMdata_type data_type;
  FMFieldPtr ret_val;
  int index;
  undefined4 in_stack_ffffffffffffffd0;
  int local_1c;
  FMFieldPtr local_8;
  
  local_1c = 0;
  while ((*(long *)(in_RDI + (long)local_1c * 0x18) != 0 &&
         (iVar1 = strcmp(*(char **)(in_RDI + (long)local_1c * 0x18),in_RSI), iVar1 != 0))) {
    local_1c = local_1c + 1;
  }
  if (*(long *)(in_RDI + (long)local_1c * 0x18) == 0) {
    local_8 = (FMFieldPtr)0x0;
  }
  else {
    FVar2 = FMstr_to_data_type(in_RSI);
    if (FVar2 == unknown_type) {
      fprintf(_stderr,"Unknown field type for field %s\n",
              *(undefined8 *)(in_RDI + (long)local_1c * 0x18));
      local_8 = (FMFieldPtr)0x0;
    }
    else {
      local_8 = (FMFieldPtr)ffs_malloc(CONCAT44(FVar2,in_stack_ffffffffffffffd0));
      local_8->src_float_format = '\0';
      local_8->target_float_format = (uchar)fm_my_float_format;
      local_8->offset = (long)*(int *)(in_RDI + (long)local_1c * 0x18 + 0x14);
      local_8->size = *(int *)(in_RDI + (long)local_1c * 0x18 + 0x10);
      local_8->data_type = FVar2;
      local_8->byte_swap = '\0';
    }
  }
  return local_8;
}

Assistant:

extern FMFieldPtr
get_FMfieldPtrFromList(FMFieldList field_list, const char *fieldname)
{
    int index;
    FMFieldPtr ret_val;
    FMdata_type data_type;

    for (index = 0; field_list[index].field_name != NULL; index++) {
	if (strcmp(field_list[index].field_name, fieldname) == 0) {
	    break;
	}
    }
    if (field_list[index].field_name == NULL)
	return NULL;

    data_type = FMstr_to_data_type(field_list[index].field_type);
    if (data_type == unknown_type) {
	fprintf(stderr, "Unknown field type for field %s\n",
		field_list[index].field_name);
	return NULL;
    }
    ret_val = (FMFieldPtr) malloc(sizeof(*ret_val));
    ret_val->src_float_format = Format_Unknown;
    ret_val->target_float_format = fm_my_float_format;
    ret_val->offset = field_list[index].field_offset;
    ret_val->size = field_list[index].field_size;
    ret_val->data_type = data_type;
    ret_val->byte_swap = 0;
    return ret_val;
}